

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall delta_complex_t::add_edge(delta_complex_t *this,index_t i,index_t j,value_t val)

{
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  allocator<long> local_4b9;
  size_type local_4b8;
  index_t local_4b0;
  size_type *local_4a8;
  size_type local_4a0;
  vector<long,_std::allocator<long>_> local_498;
  clique_t local_480;
  size_type local_410;
  index_t cli_loc_1;
  size_type local_400;
  index_t local_3f8;
  size_type *local_3f0;
  size_type local_3e8;
  vector<long,_std::allocator<long>_> local_3e0;
  size_type local_3c8;
  index_t the_cli;
  allocator<long> local_3a1;
  size_type local_3a0;
  index_t local_398;
  size_type *local_390;
  size_type local_388;
  vector<long,_std::allocator<long>_> local_380;
  delta_complex_cell_t local_368;
  value_type_conflict4 local_280;
  allocator<long> local_271;
  index_t local_270;
  size_type local_268;
  iterator local_260;
  size_type local_258;
  vector<long,_std::allocator<long>_> local_250;
  clique_t local_238;
  size_type local_1c8;
  index_t cli_loc;
  allocator<long> local_1a1;
  index_t local_1a0;
  size_type local_198;
  iterator local_190;
  size_type local_188;
  vector<long,_std::allocator<long>_> local_180;
  delta_complex_cell_t local_168;
  value_type_conflict4 local_80 [3];
  vector<long,_std::allocator<long>_> local_68;
  undefined1 local_48 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orient;
  index_t loc;
  size_type sStack_20;
  value_t val_local;
  index_t j_local;
  index_t i_local;
  delta_complex_t *this_local;
  
  sStack_20 = j;
  j_local = i;
  i_local = (index_t)this;
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,1);
  new_orient.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::size
                          (pvVar1);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_48);
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector(&local_68);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)local_48,&local_68);
  std::vector<long,_std::allocator<long>_>::~vector(&local_68);
  if (j_local < (long)sStack_20) {
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           *)local_48,0);
    local_80[0] = 1;
    std::vector<long,_std::allocator<long>_>::push_back(pvVar2,local_80);
    pvVar1 = std::
             vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ::operator[](&this->cells,1);
    local_1a0 = j_local;
    local_198 = sStack_20;
    local_190 = &local_1a0;
    local_188 = 2;
    std::allocator<long>::allocator(&local_1a1);
    __l_03._M_len = local_188;
    __l_03._M_array = local_190;
    std::vector<long,_std::allocator<long>_>::vector(&local_180,__l_03,&local_1a1);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&cli_loc,
             (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_48);
    delta_complex_cell_t::delta_complex_cell_t
              (&local_168,&local_180,
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)&cli_loc,val,
               (index_t)new_orient.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::push_back
              (pvVar1,&local_168);
    delta_complex_cell_t::~delta_complex_cell_t(&local_168);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&cli_loc);
    std::vector<long,_std::allocator<long>_>::~vector(&local_180);
    std::allocator<long>::~allocator(&local_1a1);
    pvVar3 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,1);
    local_1c8 = std::vector<clique_t,_std::allocator<clique_t>_>::size(pvVar3);
    pvVar3 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,1);
    local_270 = j_local;
    local_268 = sStack_20;
    local_260 = &local_270;
    local_258 = 2;
    std::allocator<long>::allocator(&local_271);
    __l_02._M_len = local_258;
    __l_02._M_array = local_260;
    std::vector<long,_std::allocator<long>_>::vector(&local_250,__l_02,&local_271);
    clique_t::clique_t(&local_238,&local_250,local_1c8);
    std::vector<clique_t,_std::allocator<clique_t>_>::push_back(pvVar3,&local_238);
    clique_t::~clique_t(&local_238);
    std::vector<long,_std::allocator<long>_>::~vector(&local_250);
    std::allocator<long>::~allocator(&local_271);
    pvVar3 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,1);
    pvVar4 = std::vector<clique_t,_std::allocator<clique_t>_>::back(pvVar3);
    std::vector<long,_std::allocator<long>_>::push_back
              (&pvVar4->faces,
               (value_type_conflict4 *)
               &new_orient.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar3 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,0);
    pvVar4 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar3,j_local);
    clique_t::add_coface(pvVar4,sStack_20,local_1c8);
  }
  else {
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           *)local_48,0);
    local_280 = 0;
    std::vector<long,_std::allocator<long>_>::push_back(pvVar2,&local_280);
    pvVar1 = std::
             vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ::operator[](&this->cells,1);
    local_3a0 = sStack_20;
    local_398 = j_local;
    local_390 = &local_3a0;
    local_388 = 2;
    std::allocator<long>::allocator(&local_3a1);
    __l_01._M_len = local_388;
    __l_01._M_array = (iterator)local_390;
    std::vector<long,_std::allocator<long>_>::vector(&local_380,__l_01,&local_3a1);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&the_cli,
             (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_48);
    delta_complex_cell_t::delta_complex_cell_t
              (&local_368,&local_380,
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)&the_cli,val,
               (index_t)new_orient.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::push_back
              (pvVar1,&local_368);
    delta_complex_cell_t::~delta_complex_cell_t(&local_368);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&the_cli);
    std::vector<long,_std::allocator<long>_>::~vector(&local_380);
    std::allocator<long>::~allocator(&local_3a1);
    local_400 = sStack_20;
    local_3f8 = j_local;
    local_3f0 = &local_400;
    local_3e8 = 2;
    std::allocator<long>::allocator((allocator<long> *)((long)&cli_loc_1 + 7));
    __l_00._M_len = local_3e8;
    __l_00._M_array = (iterator)local_3f0;
    std::vector<long,_std::allocator<long>_>::vector
              (&local_3e0,__l_00,(allocator<long> *)((long)&cli_loc_1 + 7));
    sVar5 = get_clique(this,&local_3e0);
    std::vector<long,_std::allocator<long>_>::~vector(&local_3e0);
    std::allocator<long>::~allocator((allocator<long> *)((long)&cli_loc_1 + 7));
    local_3c8 = sVar5;
    if (sVar5 == 0xffffffffffffffff) {
      pvVar3 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&this->cliques,1);
      local_410 = std::vector<clique_t,_std::allocator<clique_t>_>::size(pvVar3);
      pvVar3 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&this->cliques,1);
      local_4b8 = sStack_20;
      local_4b0 = j_local;
      local_4a8 = &local_4b8;
      local_4a0 = 2;
      std::allocator<long>::allocator(&local_4b9);
      __l._M_len = local_4a0;
      __l._M_array = (iterator)local_4a8;
      std::vector<long,_std::allocator<long>_>::vector(&local_498,__l,&local_4b9);
      clique_t::clique_t(&local_480,&local_498,local_410);
      std::vector<clique_t,_std::allocator<clique_t>_>::push_back(pvVar3,&local_480);
      clique_t::~clique_t(&local_480);
      std::vector<long,_std::allocator<long>_>::~vector(&local_498);
      std::allocator<long>::~allocator(&local_4b9);
      pvVar3 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&this->cliques,0);
      pvVar4 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar3,sStack_20);
      clique_t::add_coface(pvVar4,j_local,local_410);
      local_3c8 = local_410;
    }
    pvVar3 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,1);
    pvVar4 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar3,local_3c8);
    std::vector<long,_std::allocator<long>_>::push_back
              (&pvVar4->faces,
               (value_type_conflict4 *)
               &new_orient.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,0);
  pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                     (pvVar1,j_local);
  delta_complex_cell_t::add_neighbour(pvVar6,sStack_20,0);
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,0);
  pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                     (pvVar1,sStack_20);
  delta_complex_cell_t::add_neighbour(pvVar6,j_local,1);
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,0);
  pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                     (pvVar1,j_local);
  std::vector<long,_std::allocator<long>_>::push_back
            (&pvVar6->coboundary,
             (value_type_conflict4 *)
             &new_orient.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,0);
  pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                     (pvVar1,sStack_20);
  std::vector<long,_std::allocator<long>_>::push_back
            (&pvVar6->coboundary,
             (value_type_conflict4 *)
             &new_orient.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,1);
  pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::back(pvVar1);
  std::vector<long,_std::allocator<long>_>::push_back(&pvVar6->boundary,&j_local);
  pvVar1 = std::
           vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ::operator[](&this->cells,1);
  pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::back(pvVar1);
  std::vector<long,_std::allocator<long>_>::push_back
            (&pvVar6->boundary,(value_type_conflict4 *)&stack0xffffffffffffffe0);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_48);
  return;
}

Assistant:

void add_edge(index_t i,index_t j,value_t val){
		//NOTE: We assume edges are added in increasing lexicographic order,
		//this avoids always checking if relevant 2-clique already in list
		//This could be changed and it would make the code easier to read,
		//But I think it is slightly faster this way, though probably a negligible amount
		index_t loc = cells[1].size();
		std::vector<std::vector<index_t>> new_orient;
		new_orient.push_back(std::vector<index_t>());
		if( i < j ){
			//When i < j create a new clique and a new face, with edge orientation 1
			//add the new face to the new clique and also add the cofaces to the clique
			new_orient[0].push_back(1);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{i,j},new_orient,val,loc));
			index_t cli_loc = cliques[1].size();
			cliques[1].push_back(clique_t(std::vector<index_t>{i,j},cli_loc));
			cliques[1].back().faces.push_back(loc);
			cliques[0][i].add_coface(j,cli_loc);
		} else{
			//When i > j  create a new face with orientation 0
			//then check if the clique already exists, if it does not then create it
			//then add the new face the the clique
			new_orient[0].push_back(0);
			cells[1].push_back(delta_complex_cell_t(std::vector<index_t>{j,i},new_orient,val,loc));
			index_t the_cli = get_clique(std::vector<index_t>{j,i});
			if(the_cli == -1){
				index_t cli_loc = cliques[1].size();
				cliques[1].push_back(clique_t(std::vector<index_t>{j,i},cli_loc));
				cliques[0][j].add_coface(i,cli_loc);
				the_cli = cli_loc;
			}
			cliques[1][the_cli].faces.push_back(loc);
		}
		//Add the relevent neighbour and coboundary information to the vertices
		cells[0][i].add_neighbour(j,0);
		cells[0][j].add_neighbour(i,1);
		cells[0][i].coboundary.push_back(loc);
		cells[0][j].coboundary.push_back(loc);
		//Add the vertices of faces of the new created face
		cells[1].back().boundary.push_back(i);
		cells[1].back().boundary.push_back(j);
	}